

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::DeleteProperty
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  DynamicObject *aValue;
  code *pcVar2;
  undefined8 scriptContext_00;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  HostScriptContext *pHVar6;
  JavascriptFunction *function;
  Type *pTVar7;
  undefined4 *puVar8;
  RecyclableObject *ptr;
  char *this_01;
  void *local_80;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  PropertyDescriptor targetPropertyDescriptor;
  
  BVar5 = VerifyObjectAlive(this);
  if (BVar5 == 0) {
    return 0;
  }
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar6 = ThreadContext::GetPreviousHostScriptContext(this_00);
  targetPropertyDescriptor._40_8_ = pHVar6->scriptContext;
  BVar5 = EnsureInitialized(this,(ScriptContext *)targetPropertyDescriptor._40_8_);
  if (BVar5 == 0) {
    return 0;
  }
  pTVar7 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  aValue = (pTVar7[1].propertyCache.ptr)->elements[1].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
    pTVar7 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  }
  this_01 = (char *)(((pTVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                    ptr;
  bVar3 = ScriptContext::IsHeapEnumInProgress((ScriptContext *)this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x435,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar5 = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
    return BVar5;
  }
  targetPropertyDescriptor.Setter.ptr =
       GetName((CustomExternalWrapperObject *)this_01,
               (ScriptContext *)targetPropertyDescriptor._40_8_,propertyId,&local_80,
               &isPropertyNameNumeric);
  targetPropertyDescriptor.originalVar.ptr = local_80;
  targetPropertyDescriptor._32_8_ = isPropertyNameNumeric;
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  propertyNameNumericValue = this_00;
  targetPropertyDescriptor.Value.ptr = function;
  targetPropertyDescriptor.Getter.ptr = this;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar4) {
    ptr = (RecyclableObject *)
          DeleteProperty::anon_class_48_6_c6a7eacb::operator()
                    ((anon_class_48_6_c6a7eacb *)&propertyNameNumericValue);
    bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00a117ed:
    if (bVar4 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ptr = (RecyclableObject *)
            DeleteProperty::anon_class_48_6_c6a7eacb::operator()
                      ((anon_class_48_6_c6a7eacb *)&propertyNameNumericValue);
      bVar4 = ThreadContext::IsOnStack(ptr);
      goto LAB_00a117ed;
    }
    IVar1 = this_00->implicitCallFlags;
    ptr = (RecyclableObject *)
          DeleteProperty::anon_class_48_6_c6a7eacb::operator()
                    ((anon_class_48_6_c6a7eacb *)&propertyNameNumericValue);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  scriptContext_00 = targetPropertyDescriptor._40_8_;
  this_00->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(ptr,(ScriptContext *)targetPropertyDescriptor._40_8_);
  if (BVar5 == 0) {
    BVar5 = 0;
    if ((flags & PropertyOperation_StrictMode) != PropertyOperation_None) goto LAB_00a118f0;
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyNameNumericValue);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                      ((RecyclableObject *)this,propertyId,(ScriptContext *)scriptContext_00,
                       (PropertyDescriptor *)&propertyNameNumericValue);
    if ((BVar5 != 0) &&
       (bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&propertyNameNumericValue),
       !bVar3)) {
LAB_00a118f0:
      JavascriptError::ThrowTypeError
                ((ScriptContext *)scriptContext_00,-0x7ff5ea14,L"deleteProperty");
    }
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL CustomExternalWrapperObject::DeleteProperty(Js::PropertyId propertyId, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = GetScriptContext()->GetThreadContext();

    // Caller does not pass requestContext. Retrieve from host scriptContext stack.
    Js::ScriptContext* requestContext =
        threadContext->GetPreviousHostScriptContext()->GetScriptContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    RecyclableObject * targetObj = this;
    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* deleteMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->deletePropertyTrap != nullptr)
    {
        deleteMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->deletePropertyTrap);
    }

    Assert(!GetScriptContext()->IsHeapEnumInProgress());
    if (nullptr == deleteMethod)
    {
        return __super::DeleteProperty(propertyId, flags);
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Js::Var deletePropertyResult = threadContext->ExecuteImplicitCall(deleteMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, deleteMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    BOOL trapResult = Js::JavascriptConversion::ToBoolean(deletePropertyResult, requestContext);
    if (!trapResult)
    {
        if (flags & Js::PropertyOperation_StrictMode)
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
        }
        return trapResult;
    }

    Js::PropertyDescriptor targetPropertyDescriptor;
    if (!Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetPropertyDescriptor))
    {
        return TRUE;
    }
    if (!targetPropertyDescriptor.IsConfigurable())
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
    }
    return TRUE;
}